

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfc_tiles.cpp
# Opt level: O0

int sfc_tiles(int argc,char **argv)

{
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  string_view fmt_07;
  string_view fmt_08;
  string_view fmt_09;
  string_view fmt_10;
  undefined4 in_mode;
  bool bVar1;
  uint uVar2;
  runtime_error *prVar3;
  Mode extraout_EDX;
  Mode extraout_EDX_00;
  Mode mode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  uint *args_00;
  v10 *pvVar4;
  string *psVar5;
  uint *args_2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar6;
  string_view fmt_11;
  format_args args_01;
  exception *e_1;
  undefined1 local_1a28 [8];
  Image tileset_image;
  uint local_198c;
  uint *local_1988;
  size_t local_1980;
  undefined1 local_1974 [12];
  size_t local_1968;
  undefined1 local_1959;
  uint local_1958;
  uint local_1954;
  v10 *local_1950;
  char *local_1948;
  string local_1940;
  reference local_1920;
  Image *img;
  iterator __end2;
  iterator __begin2;
  vector<sfc::Image,_std::allocator<sfc::Image>_> *__range2;
  char *local_18e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18d8;
  Palette local_18d0;
  char *local_18a0;
  undefined8 local_1898;
  Tileset local_1890;
  undefined1 local_1858 [8];
  Palette palette;
  string local_1810;
  char *local_17f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_17e8;
  undefined1 local_17e0 [8];
  vector<sfc::Image,_std::allocator<sfc::Image>_> crops;
  Image image;
  byte_vec_t local_1728;
  Tileset local_1710;
  undefined1 local_16d8 [8];
  Tileset tileset;
  exception *e;
  allocator<char> local_1629;
  string local_1628;
  allocator<char> local_1601;
  string local_1600;
  allocator<char> local_15d9;
  string local_15d8;
  allocator<char> local_15b1;
  string local_15b0;
  allocator<char> local_1589;
  string local_1588;
  string local_1568;
  int local_1548;
  allocator<char> local_1541;
  string local_1540;
  allocator<char> local_1519;
  string local_1518;
  allocator<char> local_14f1;
  string local_14f0;
  allocator<char> local_14c9;
  string local_14c8;
  allocator<char> local_14a1;
  string local_14a0;
  allocator<char> local_1479;
  string local_1478;
  allocator<char> local_1451;
  string local_1450;
  allocator<char> local_1429;
  string local_1428;
  allocator<char> local_1401;
  string local_1400;
  allocator<char> local_13d9;
  string local_13d8;
  allocator<char> local_13b1;
  string local_13b0;
  allocator<char> local_1389;
  string local_1388;
  allocator<char> local_1361;
  string local_1360;
  allocator<char> local_1339;
  string local_1338;
  allocator<char> local_1311;
  string local_1310;
  allocator<char> local_12e9;
  string local_12e8;
  allocator<char> local_12c1;
  string local_12c0;
  allocator<char> local_1299;
  string local_1298;
  allocator<char> local_1271;
  string local_1270;
  allocator<char> local_1249;
  string local_1248;
  allocator<char> local_1221;
  string local_1220;
  allocator<char> local_11f9;
  string local_11f8;
  allocator<char> local_11d1;
  string local_11d0;
  allocator<char> local_11a9;
  string local_11a8;
  allocator<char> local_1181;
  string local_1180;
  allocator<char> local_1159;
  string local_1158;
  allocator<char> local_1131;
  string local_1130;
  allocator<char> local_1109;
  string local_1108;
  allocator<char> local_10e1;
  string local_10e0;
  allocator<char> local_10b9;
  string local_10b8;
  allocator<char> local_1091;
  string local_1090;
  allocator<char> local_1069;
  string local_1068;
  allocator<char> local_1041;
  string local_1040;
  allocator<char> local_1019;
  string local_1018;
  allocator<char> local_ff1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ff0;
  allocator<char> local_fc9;
  string local_fc8;
  allocator<char> local_fa1;
  string local_fa0;
  allocator<char> local_f79;
  string local_f78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f58;
  allocator<char> local_f31;
  string local_f30;
  allocator<char> local_f09;
  string local_f08;
  allocator<char> local_ee1;
  string local_ee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ec0;
  allocator<char> local_e99;
  string local_e98;
  allocator<char> local_e71;
  string local_e70;
  allocator<char> local_e49;
  string local_e48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e28;
  allocator<char> local_e01;
  string local_e00;
  allocator<char> local_dd9;
  string local_dd8;
  allocator<char> local_db1;
  string local_db0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d90;
  allocator<char> local_d69;
  string local_d68;
  allocator<char> local_d41;
  string local_d40;
  allocator<char> local_d19;
  string local_d18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cf8;
  allocator<char> local_cd1;
  string local_cd0;
  allocator<char> local_ca9;
  string local_ca8;
  undefined1 local_c78 [8];
  Options options;
  string mode_str;
  undefined1 local_b28 [6];
  bool help;
  bool verbose;
  Settings settings;
  char **argv_local;
  int argc_local;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_a50;
  char *local_a48;
  size_t local_a40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_a38 [2];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_a28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int> *vargs_1;
  char *local_a18;
  size_t sStack_a10;
  format_args local_a08;
  char *local_9f8;
  size_t local_9f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_9e8 [2];
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_9d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int> *vargs;
  char *local_9c8;
  size_t sStack_9c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*> *vargs_13
  ;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*> *vargs_2;
  format_args local_8f8;
  char *local_8e8;
  size_t local_8e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_8d8 [2];
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_8c8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_3;
  char *local_8b8;
  size_t sStack_8b0;
  format_args local_8a8;
  char *local_898;
  size_t local_890;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_888;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_860;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *vargs_4;
  v10 *local_850;
  char *local_848;
  size_t sStack_840;
  format_args local_838;
  char *local_828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_820;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_818;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_7f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_8;
  v10 *local_7e0;
  char *local_7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_7d0;
  format_args local_7c8;
  char *local_7b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7a8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_780;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_5;
  v10 *local_770;
  char *local_768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_760;
  format_args local_758;
  char *local_748;
  size_t local_740;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_unsigned_int,_unsigned_int>
  local_738;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_unsigned_int,_unsigned_int>
  *local_708;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_unsigned_int,_unsigned_int>
  *vargs_6;
  uint *local_6f8;
  rgba_t *local_6f0;
  char *local_6e8;
  size_t sStack_6e0;
  format_args local_6d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_6c8;
  size_t local_6c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_6b8 [3];
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_6a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *vargs_7;
  size_t sStack_690;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  local_688;
  undefined1 local_660 [16];
  v10 *local_650;
  char *local_648;
  uint *local_640;
  v10 *local_638;
  v10 *local_630;
  char *pcStack_628;
  string *local_620;
  format_args local_618;
  char *local_608;
  size_t local_600;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_5f8 [2];
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_5e8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int> *vargs_9;
  char *local_5d8;
  size_t sStack_5d0;
  format_args local_5c8;
  uint *local_5b8;
  size_t local_5b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  local_5a8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  *local_580;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  *vargs_10;
  v10 *local_570;
  uint *local_568;
  size_t sStack_560;
  format_args local_558;
  char *local_548;
  size_t local_540;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_538 [2];
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_528;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_12;
  char *local_518;
  size_t sStack_510;
  format_args local_508;
  char *local_4f8;
  size_t local_4f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_4e8 [3];
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_4d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_11;
  char *local_4c0;
  size_t sStack_4b8;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_4b0;
  format_args *local_4a8;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_4a0;
  format_args *local_498;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_490;
  format_args *local_488;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_480;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_478;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_470;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_468;
  undefined8 local_460;
  format_args *local_458;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_450;
  undefined8 local_448;
  format_args *local_440;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_438;
  undefined8 local_430;
  format_args *local_428;
  char **local_420;
  char *local_418;
  size_t sStack_410;
  char **local_400;
  char *local_3f8;
  size_t sStack_3f0;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_3e0;
  format_args *local_3d8;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_3d0;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_3c8;
  undefined8 local_3c0;
  format_args *local_3b8;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_3b0;
  format_args *local_3a8;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_3a0;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_398;
  undefined8 local_390;
  format_args *local_388;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_380;
  int *local_378;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_370;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_368;
  undefined8 local_360;
  int *local_358;
  char **local_2b0;
  char *local_2a8;
  size_t sStack_2a0;
  char **local_290;
  char *local_288;
  size_t sStack_280;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_270;
  format_args *local_268;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_260;
  undefined8 local_258;
  format_args *local_250;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_248;
  char **local_240;
  char *local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_230;
  char **local_220;
  char *local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_210;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_200;
  format_args *local_1f8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1f0;
  undefined8 local_1e8;
  format_args *local_1e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1d0;
  format_args *local_1c8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1c0;
  undefined8 local_1b8;
  format_args *local_1b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1a8;
  char **local_1a0;
  char *local_198;
  size_t sStack_190;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_unsigned_int,_unsigned_int>
  *local_180;
  format_args *local_178;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_unsigned_int,_unsigned_int>
  *local_170;
  undefined8 local_168;
  format_args *local_160;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_unsigned_int,_unsigned_int>
  *local_158;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_150;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_148;
  size_t sStack_140;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_130;
  format_args *local_128;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_120;
  undefined8 local_118;
  format_args *local_110;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_108;
  v10 **local_100;
  v10 *local_f8;
  char *pcStack_f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  *local_e0;
  format_args *local_d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  *local_d0;
  undefined8 local_c8;
  format_args *local_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  *local_b8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  *local_b0;
  undefined1 *local_a8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  *local_a0;
  undefined8 local_98;
  undefined1 *local_90;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  *local_88;
  char **local_80;
  char *local_78;
  size_t sStack_70;
  uint **local_60;
  uint *local_58;
  size_t sStack_50;
  char **local_40;
  char *local_38;
  size_t sStack_30;
  char **local_20;
  char *local_18;
  size_t sStack_10;
  
  settings._184_8_ = argv;
  std::__cxx11::string::string((string *)local_b28);
  std::__cxx11::string::string((string *)(settings.in_image.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(settings.in_data.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(settings.in_palette.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(settings.out_data.field_2._M_local_buf + 8));
  settings.out_image.field_2._8_4_ = 0;
  settings.out_image.field_2._12_4_ = 0;
  settings.mode._0_1_ = none;
  settings.mode._1_1_ = none >> 8;
  settings.bpp = 0;
  settings.no_discard = false;
  settings.no_flip = false;
  settings._170_2_ = 0;
  settings.tile_w._0_1_ = 0;
  settings.tile_w._1_1_ = 0;
  settings.tile_h = 0;
  settings.no_remap = false;
  settings.sprite_mode = false;
  settings._182_2_ = 0;
  mode_str.field_2._M_local_buf[0xf] = '\0';
  mode_str.field_2._M_local_buf[0xe] = '\0';
  std::__cxx11::string::string((string *)(options.optstr.field_2._M_local_buf + 8));
  Options::Options((Options *)local_c78);
  options.Header.field_2._12_4_ = 0x1c;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c78,
             "Usage: superfamiconv tiles [<options>]\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ca8,"in-image",&local_ca9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_cd0,"Input: image",&local_cd1)
  ;
  std::__cxx11::string::string((string *)&local_cf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d18,"",&local_d19);
  Options::Add<std::__cxx11::string>
            ((Options *)local_c78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b28,'i',
             &local_ca8,&local_cd0,&local_cf8,&local_d18);
  std::__cxx11::string::~string((string *)&local_d18);
  std::allocator<char>::~allocator(&local_d19);
  std::__cxx11::string::~string((string *)&local_cf8);
  std::__cxx11::string::~string((string *)&local_cd0);
  std::allocator<char>::~allocator(&local_cd1);
  std::__cxx11::string::~string((string *)&local_ca8);
  std::allocator<char>::~allocator(&local_ca9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d40,"in-data",&local_d41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d68,"Input: native data",&local_d69);
  std::__cxx11::string::string((string *)&local_d90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_db0,"",&local_db1);
  Options::Add<std::__cxx11::string>
            ((Options *)local_c78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&settings.in_image.field_2 + 8),'n',&local_d40,&local_d68,&local_d90,&local_db0)
  ;
  std::__cxx11::string::~string((string *)&local_db0);
  std::allocator<char>::~allocator(&local_db1);
  std::__cxx11::string::~string((string *)&local_d90);
  std::__cxx11::string::~string((string *)&local_d68);
  std::allocator<char>::~allocator(&local_d69);
  std::__cxx11::string::~string((string *)&local_d40);
  std::allocator<char>::~allocator(&local_d41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_dd8,"in-palette",&local_dd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e00,"Input: palette (native/json)",&local_e01);
  std::__cxx11::string::string((string *)&local_e28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e48,"",&local_e49);
  Options::Add<std::__cxx11::string>
            ((Options *)local_c78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&settings.in_data.field_2 + 8),'p',&local_dd8,&local_e00,&local_e28,&local_e48);
  std::__cxx11::string::~string((string *)&local_e48);
  std::allocator<char>::~allocator(&local_e49);
  std::__cxx11::string::~string((string *)&local_e28);
  std::__cxx11::string::~string((string *)&local_e00);
  std::allocator<char>::~allocator(&local_e01);
  std::__cxx11::string::~string((string *)&local_dd8);
  std::allocator<char>::~allocator(&local_dd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e70,"out-data",&local_e71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e98,"Output: native data",&local_e99);
  std::__cxx11::string::string((string *)&local_ec0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ee0,"",&local_ee1);
  Options::Add<std::__cxx11::string>
            ((Options *)local_c78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&settings.in_palette.field_2 + 8),'d',&local_e70,&local_e98,&local_ec0,
             &local_ee0);
  std::__cxx11::string::~string((string *)&local_ee0);
  std::allocator<char>::~allocator(&local_ee1);
  std::__cxx11::string::~string((string *)&local_ec0);
  std::__cxx11::string::~string((string *)&local_e98);
  std::allocator<char>::~allocator(&local_e99);
  std::__cxx11::string::~string((string *)&local_e70);
  std::allocator<char>::~allocator(&local_e71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f08,"out-image",&local_f09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f30,"Output: image",&local_f31);
  std::__cxx11::string::string((string *)&local_f58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f78,"",&local_f79);
  Options::Add<std::__cxx11::string>
            ((Options *)local_c78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&settings.out_data.field_2 + 8),'o',&local_f08,&local_f30,&local_f58,&local_f78)
  ;
  std::__cxx11::string::~string((string *)&local_f78);
  std::allocator<char>::~allocator(&local_f79);
  std::__cxx11::string::~string((string *)&local_f58);
  std::__cxx11::string::~string((string *)&local_f30);
  std::allocator<char>::~allocator(&local_f31);
  std::__cxx11::string::~string((string *)&local_f08);
  std::allocator<char>::~allocator(&local_f09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_fa0,"mode",&local_fa1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fc8,"Mode <default: snes>",&local_fc9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ff0,"snes",&local_ff1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1018,"Settings",&local_1019);
  Options::Add<std::__cxx11::string>
            ((Options *)local_c78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&options.optstr.field_2 + 8),'M',&local_fa0,&local_fc8,&local_ff0,&local_1018);
  std::__cxx11::string::~string((string *)&local_1018);
  std::allocator<char>::~allocator(&local_1019);
  std::__cxx11::string::~string((string *)&local_ff0);
  std::allocator<char>::~allocator(&local_ff1);
  std::__cxx11::string::~string((string *)&local_fc8);
  std::allocator<char>::~allocator(&local_fc9);
  std::__cxx11::string::~string((string *)&local_fa0);
  std::allocator<char>::~allocator(&local_fa1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1040,"bpp",&local_1041);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1068,"Bits per pixel",&local_1069);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1090,"Settings",&local_1091);
  Options::Add<unsigned_int>
            ((Options *)local_c78,(uint *)(settings.out_image.field_2._M_local_buf + 0xc),'B',
             &local_1040,&local_1068,4,&local_1090);
  std::__cxx11::string::~string((string *)&local_1090);
  std::allocator<char>::~allocator(&local_1091);
  std::__cxx11::string::~string((string *)&local_1068);
  std::allocator<char>::~allocator(&local_1069);
  std::__cxx11::string::~string((string *)&local_1040);
  std::allocator<char>::~allocator(&local_1041);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_10b8,"tile-width",&local_10b9)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_10e0,"Tile width",&local_10e1)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1108,"Settings",&local_1109);
  Options::Add<unsigned_int>
            ((Options *)local_c78,&settings.bpp,'W',&local_10b8,&local_10e0,8,&local_1108);
  std::__cxx11::string::~string((string *)&local_1108);
  std::allocator<char>::~allocator(&local_1109);
  std::__cxx11::string::~string((string *)&local_10e0);
  std::allocator<char>::~allocator(&local_10e1);
  std::__cxx11::string::~string((string *)&local_10b8);
  std::allocator<char>::~allocator(&local_10b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1130,"tile-height",&local_1131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1158,"Tile height",&local_1159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1180,"Settings",&local_1181);
  Options::Add<unsigned_int>
            ((Options *)local_c78,(uint *)&settings.no_discard,'H',&local_1130,&local_1158,8,
             &local_1180);
  std::__cxx11::string::~string((string *)&local_1180);
  std::allocator<char>::~allocator(&local_1181);
  std::__cxx11::string::~string((string *)&local_1158);
  std::allocator<char>::~allocator(&local_1159);
  std::__cxx11::string::~string((string *)&local_1130);
  std::allocator<char>::~allocator(&local_1131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_11a8,"no-remap",&local_11a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_11d0,"Don\'t remap colors",&local_11d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_11f8,"Settings",&local_11f9);
  Options::AddSwitch((Options *)local_c78,(bool *)&settings.tile_w,'R',&local_11a8,&local_11d0,false
                     ,&local_11f8);
  std::__cxx11::string::~string((string *)&local_11f8);
  std::allocator<char>::~allocator(&local_11f9);
  std::__cxx11::string::~string((string *)&local_11d0);
  std::allocator<char>::~allocator(&local_11d1);
  std::__cxx11::string::~string((string *)&local_11a8);
  std::allocator<char>::~allocator(&local_11a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1220,"no-discard",&local_1221)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1248,"Don\'t discard redundant tiles",&local_1249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1270,"Settings",&local_1271);
  Options::AddSwitch((Options *)local_c78,(bool *)&settings.mode,'D',&local_1220,&local_1248,false,
                     &local_1270);
  std::__cxx11::string::~string((string *)&local_1270);
  std::allocator<char>::~allocator(&local_1271);
  std::__cxx11::string::~string((string *)&local_1248);
  std::allocator<char>::~allocator(&local_1249);
  std::__cxx11::string::~string((string *)&local_1220);
  std::allocator<char>::~allocator(&local_1221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1298,"no-flip",&local_1299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12c0,"Don\'t discard using tile flipping",&local_12c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e8,"Settings",&local_12e9);
  Options::AddSwitch((Options *)local_c78,(bool *)((long)&settings.mode + 1),'F',&local_1298,
                     &local_12c0,false,&local_12e8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::allocator<char>::~allocator(&local_12e9);
  std::__cxx11::string::~string((string *)&local_12c0);
  std::allocator<char>::~allocator(&local_12c1);
  std::__cxx11::string::~string((string *)&local_1298);
  std::allocator<char>::~allocator(&local_1299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1310,"sprite-mode",&local_1311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1338,"Apply sprite output settings",&local_1339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1360,"Settings",&local_1361);
  Options::AddSwitch((Options *)local_c78,(bool *)((long)&settings.tile_w + 1),'S',&local_1310,
                     &local_1338,false,&local_1360);
  std::__cxx11::string::~string((string *)&local_1360);
  std::allocator<char>::~allocator(&local_1361);
  std::__cxx11::string::~string((string *)&local_1338);
  std::allocator<char>::~allocator(&local_1339);
  std::__cxx11::string::~string((string *)&local_1310);
  std::allocator<char>::~allocator(&local_1311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1388,"max-tiles",&local_1389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_13b0,"Maximum number of tiles",&local_13b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_13d8,"Settings",&local_13d9);
  Options::Add<unsigned_int>
            ((Options *)local_c78,&settings.tile_h,'T',&local_1388,&local_13b0,0,&local_13d8);
  std::__cxx11::string::~string((string *)&local_13d8);
  std::allocator<char>::~allocator(&local_13d9);
  std::__cxx11::string::~string((string *)&local_13b0);
  std::allocator<char>::~allocator(&local_13b1);
  std::__cxx11::string::~string((string *)&local_1388);
  std::allocator<char>::~allocator(&local_1389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1400,"out-image-width",&local_1401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1428,"Width of out-image",&local_1429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1450,"Settings",&local_1451);
  Options::Add<unsigned_int>
            ((Options *)local_c78,(uint *)&settings.no_remap,'\0',&local_1400,&local_1428,0,
             &local_1450);
  std::__cxx11::string::~string((string *)&local_1450);
  std::allocator<char>::~allocator(&local_1451);
  std::__cxx11::string::~string((string *)&local_1428);
  std::allocator<char>::~allocator(&local_1429);
  std::__cxx11::string::~string((string *)&local_1400);
  std::allocator<char>::~allocator(&local_1401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1478,"verbose",&local_1479);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14a0,"Verbose logging",&local_14a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"_",&local_14c9);
  Options::AddSwitch((Options *)local_c78,(bool *)(mode_str.field_2._M_local_buf + 0xf),'v',
                     &local_1478,&local_14a0,false,&local_14c8);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::allocator<char>::~allocator(&local_14c9);
  std::__cxx11::string::~string((string *)&local_14a0);
  std::allocator<char>::~allocator(&local_14a1);
  std::__cxx11::string::~string((string *)&local_1478);
  std::allocator<char>::~allocator(&local_1479);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14f0,"help",&local_14f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1518,"Show this help",&local_1519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1540,"_",&local_1541);
  Options::AddSwitch((Options *)local_c78,(bool *)(mode_str.field_2._M_local_buf + 0xe),'h',
                     &local_14f0,&local_1518,false,&local_1540);
  std::__cxx11::string::~string((string *)&local_1540);
  std::allocator<char>::~allocator(&local_1541);
  std::__cxx11::string::~string((string *)&local_1518);
  std::allocator<char>::~allocator(&local_1519);
  std::__cxx11::string::~string((string *)&local_14f0);
  std::allocator<char>::~allocator(&local_14f1);
  bVar1 = Options::Parse((Options *)local_c78,argc,(char **)settings._184_8_);
  if (bVar1) {
    if ((argc < 3) || ((mode_str.field_2._M_local_buf[0xe] & 1U) != 0)) {
      Options::Usage_abi_cxx11_(&local_1568,(Options *)local_c78);
      std::operator<<((ostream *)&std::cout,(string *)&local_1568);
      std::__cxx11::string::~string((string *)&local_1568);
      argv_local._4_4_ = 0;
      local_1548 = 1;
    }
    else {
      settings.out_image.field_2._8_4_ = sfc::mode((string *)((long)&options.optstr.field_2 + 8));
      if (((settings.tile_w._1_1_ & 1) != 0) && (settings.out_image.field_2._8_4_ == pce)) {
        settings.out_image.field_2._8_4_ = 9;
      }
      if (settings.out_image.field_2._8_4_ == 9) {
        settings.tile_w._1_1_ = 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1588,"bpp",&local_1589);
      bVar1 = Options::WasSet((Options *)local_c78,&local_1588);
      std::__cxx11::string::~string((string *)&local_1588);
      std::allocator<char>::~allocator(&local_1589);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        settings.out_image.field_2._12_4_ =
             sfc::default_bpp_for_mode(settings.out_image.field_2._8_4_);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_15b0,"tile-width",&local_15b1);
      bVar1 = Options::WasSet((Options *)local_c78,&local_15b0);
      std::__cxx11::string::~string((string *)&local_15b0);
      std::allocator<char>::~allocator(&local_15b1);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        settings.bpp = sfc::default_tile_size_for_mode(settings.out_image.field_2._8_4_);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_15d8,"tile-height",&local_15d9);
      bVar1 = Options::WasSet((Options *)local_c78,&local_15d8);
      std::__cxx11::string::~string((string *)&local_15d8);
      std::allocator<char>::~allocator(&local_15d9);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        settings._168_4_ = sfc::default_tile_size_for_mode(settings.out_image.field_2._8_4_);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1600,"no-flip",&local_1601);
      bVar1 = Options::WasSet((Options *)local_c78,&local_1600);
      std::__cxx11::string::~string((string *)&local_1600);
      std::allocator<char>::~allocator(&local_1601);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        bVar1 = sfc::tile_flipping_allowed_for_mode(settings.out_image.field_2._8_4_);
        settings.mode._1_1_ = (bVar1 ^ 0xff) & 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1628,"max-tiles",&local_1629);
      bVar1 = Options::WasSet((Options *)local_c78,&local_1628);
      std::__cxx11::string::~string((string *)&local_1628);
      std::allocator<char>::~allocator(&local_1629);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        settings.tile_h = sfc::max_tile_count_for_mode(settings.out_image.field_2._8_4_);
      }
      pvVar4 = (v10 *)(ulong)(uint)settings.out_image.field_2._8_4_;
      bVar1 = sfc::tile_width_allowed_for_mode(settings.bpp,settings.out_image.field_2._8_4_);
      if ((!bVar1) &&
         (settings.bpp = sfc::default_tile_size_for_mode(settings.out_image.field_2._8_4_),
         (mode_str.field_2._M_local_buf[0xf] & 1U) != 0)) {
        vargs = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
                 *)&settings.bpp;
        local_9c8 = "Tile width not allowed for specified mode, using default ({})\n";
        sStack_9c0 = 0x3e;
        local_9e8[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int>
                                 (vargs,pvVar4,
                                  (uint *)
                                  "Tile width not allowed for specified mode, using default ({})\n")
        ;
        local_9d8 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_9e8;
        local_420 = &local_9c8;
        local_9f8 = local_9c8;
        local_9f0 = sStack_9c0;
        local_3a8 = &local_a08;
        local_390 = 2;
        local_a08.desc_ = 2;
        local_a08.field_1.values_ = local_9d8;
        fmt_00.size_ = sStack_9c0;
        fmt_00.data_ = local_9c8;
        local_418 = local_9f8;
        sStack_410 = local_9f0;
        local_3b0 = local_9d8;
        local_3a0 = local_9d8;
        local_398 = local_9d8;
        local_388 = local_3a8;
        ::fmt::v10::vprint(fmt_00,local_a08);
      }
      pvVar4 = (v10 *)(ulong)(uint)settings.out_image.field_2._8_4_;
      bVar1 = sfc::tile_height_allowed_for_mode(settings._168_4_,settings.out_image.field_2._8_4_);
      if ((!bVar1) &&
         (settings._168_4_ = sfc::default_tile_size_for_mode(settings.out_image.field_2._8_4_),
         (mode_str.field_2._M_local_buf[0xf] & 1U) != 0)) {
        vargs_1 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
                   *)&settings.no_discard;
        local_a18 = "Tile height not allowed for specified mode, using default ({})\n";
        sStack_a10 = 0x3f;
        local_a38[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int>
                                 (vargs_1,pvVar4,
                                  (uint *)
                                  "Tile height not allowed for specified mode, using default ({})\n"
                                 );
        local_a28 = local_a38;
        local_400 = &local_a18;
        local_a48 = local_a18;
        local_a40 = sStack_a10;
        local_378 = &argc_local;
        local_360 = 2;
        _argc_local = 2;
        local_a50 = local_a28;
        fmt.size_ = sStack_a10;
        fmt.data_ = local_a18;
        local_3f8 = local_a48;
        sStack_3f0 = local_a40;
        local_380 = local_a28;
        local_370 = local_a28;
        local_368 = local_a28;
        local_358 = local_378;
        ::fmt::v10::vprint(fmt,_argc_local);
      }
      if ((settings.tile_w._1_1_ & 1) != 0) {
        settings.mode._1_1_ = 1;
        settings.mode._0_1_ = snes;
      }
      bVar1 = sfc::bpp_allowed_for_mode
                        (settings.out_image.field_2._12_4_,settings.out_image.field_2._8_4_);
      if (!bVar1) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,"bpp setting not allowed for specified mode");
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_1548 = 0;
    }
  }
  else {
    argv_local._4_4_ = 1;
    local_1548 = 1;
  }
  Options::~Options((Options *)local_c78);
  std::__cxx11::string::~string((string *)(options.optstr.field_2._M_local_buf + 8));
  if (local_1548 == 0) {
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_b28);
    mode = extraout_EDX;
    if ((bVar1) &&
       (bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&settings.in_image.field_2 + 8)), mode = extraout_EDX_00, bVar1)) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"Input image or native data required");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((mode_str.field_2._M_local_buf[0xf] & 1U) != 0) {
      pvVar4 = (v10 *)(ulong)(uint)settings.out_image.field_2._8_4_;
      sfc::mode_abi_cxx11_
                ((string *)
                 &tileset._tiles.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(sfc *)pvVar4,mode);
      local_8b8 = "Performing tiles operation in \"{}\" mode\n";
      sStack_8b0 = 0x28;
      vargs_3 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&tileset._tiles.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage;
      local_8d8[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                               (vargs_3,pvVar4,args);
      local_8c8 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_8d8;
      local_2b0 = &local_8b8;
      local_8e8 = local_8b8;
      local_8e0 = sStack_8b0;
      local_488 = &local_8f8;
      local_460 = 0xd;
      local_8f8.desc_ = 0xd;
      local_8f8.field_1.values_ = local_8c8;
      fmt_01.size_ = sStack_8b0;
      fmt_01.data_ = local_8b8;
      local_490 = local_8c8;
      local_480 = local_8c8;
      local_468 = local_8c8;
      local_458 = local_488;
      local_2a8 = local_8e8;
      sStack_2a0 = local_8e0;
      ::fmt::v10::vprint(fmt_01,local_8f8);
      std::__cxx11::string::~string
                ((string *)
                 &tileset._tiles.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    sfc::Tileset::Tileset((Tileset *)local_16d8,snes,4,8,8,false,false,false,0);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&settings.in_image.field_2 + 8));
    if (bVar1) {
      sfc::Image::Image((Image *)&crops.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                        (string *)local_b28);
      args_2 = (uint *)(ulong)(uint)settings.out_image.field_2._8_4_;
      sfc::Image::crops((vector<sfc::Image,_std::allocator<sfc::Image>_> *)local_17e0,
                        (Image *)&crops.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,settings.bpp,
                        settings._168_4_,settings.out_image.field_2._8_4_);
      if ((mode_str.field_2._M_local_buf[0xf] & 1U) != 0) {
        local_17f0 = "Loaded image from \"{}\" ({})\n";
        local_17e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1c;
        sfc::Image::description_abi_cxx11_
                  (&local_1810,
                   (Image *)&crops.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
        local_768 = local_17f0;
        pbStack_760 = local_17e8;
        vargs_5 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1810;
        local_770 = (v10 *)local_b28;
        ::fmt::v10::
        make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,std::__cxx11::string_const>
                  (&local_7a8,(v10 *)local_b28,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vargs_5,
                   local_17e8);
        local_780 = &local_7a8;
        local_240 = &local_768;
        local_7b8 = local_768;
        local_7b0 = pbStack_760;
        local_1f8 = &local_7c8;
        local_1e8 = 0xdd;
        local_7c8.desc_ = 0xdd;
        local_7c8.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_780;
        fmt_04.size_ = (size_t)pbStack_760;
        fmt_04.data_ = local_768;
        local_238 = local_7b8;
        pbStack_230 = local_7b0;
        local_200 = local_780;
        local_1f0 = local_780;
        local_1e0 = local_1f8;
        local_1d8 = local_780;
        ::fmt::v10::vprint(fmt_04,local_7c8);
        std::__cxx11::string::~string((string *)&local_1810);
      }
      if (((settings.out_image.field_2._8_4_ == 8) && ((settings.tile_w._1_1_ & 1) != 0)) &&
         ((uVar2 = sfc::Image::width((Image *)&crops.
                                               super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage),
          (uVar2 & 0xf) != 0 ||
          (uVar2 = sfc::Image::height((Image *)&crops.
                                                super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage),
          (uVar2 & 0xf) != 0)))) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar3,"pce/sprite-mode requires image dimensions to be a multiple of 16");
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((mode_str.field_2._M_local_buf[0xf] & 1U) != 0) {
        palette._40_8_ =
             std::vector<sfc::Image,_std::allocator<sfc::Image>_>::size
                       ((vector<sfc::Image,_std::allocator<sfc::Image>_> *)local_17e0);
        local_6f8 = &settings.bpp;
        vargs_6 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_unsigned_int,_unsigned_int>
                   *)&settings.no_discard;
        local_6e8 = "Image sliced into {} {}x{}px tiles\n";
        sStack_6e0 = 0x23;
        local_6f0 = &palette._col0;
        ::fmt::v10::
        make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_long,unsigned_int,unsigned_int>
                  (&local_738,(v10 *)local_6f0,(unsigned_long *)local_6f8,(uint *)vargs_6,args_2);
        local_708 = &local_738;
        local_1a0 = &local_6e8;
        local_748 = local_6e8;
        local_740 = sStack_6e0;
        local_178 = &local_758;
        local_168 = 0x224;
        local_758.desc_ = 0x224;
        local_758.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_708;
        fmt_05.size_ = sStack_6e0;
        fmt_05.data_ = local_6e8;
        local_198 = local_748;
        sStack_190 = local_740;
        local_180 = local_708;
        local_170 = local_708;
        local_160 = local_178;
        local_158 = local_708;
        ::fmt::v10::vprint(fmt_05,local_758);
      }
      sfc::Palette::Palette((Palette *)local_1858,snes,0,0);
      aVar6._0_4_ = (byte)(undefined1)settings.mode & 1;
      aVar6._4_4_ = 0;
      sfc::Tileset::Tileset
                (&local_1890,settings.out_image.field_2._8_4_,settings.out_image.field_2._12_4_,
                 settings.bpp,settings._168_4_,SUB41(aVar6._0_4_,0),(bool)(settings.mode._1_1_ & 1),
                 (bool)((byte)settings.tile_w & 1),settings.tile_h);
      sfc::Tileset::operator=((Tileset *)local_16d8,&local_1890);
      sfc::Tileset::~Tileset(&local_1890);
      if (((byte)settings.tile_w & 1) == 0) {
        bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&settings.in_data.field_2 + 8));
        in_mode = settings.out_image.field_2._8_4_;
        if (bVar1) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar3,"Input palette required (except in --no-remap mode)");
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar2 = sfc::palette_size_at_bpp(settings.out_image.field_2._12_4_);
        sfc::Palette::Palette
                  (&local_18d0,(string *)((long)&settings.in_data.field_2 + 8),in_mode,uVar2);
        sfc::Palette::operator=((Palette *)local_1858,&local_18d0);
        sfc::Palette::~Palette(&local_18d0);
        uVar2 = sfc::Palette::size((Palette *)local_1858);
        if (uVar2 == 0) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar3,"Input palette size is zero");
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if ((mode_str.field_2._M_local_buf[0xf] & 1U) != 0) {
          local_18e0 = "Remapping tile data from palette \"{}\" ({})\n";
          local_18d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2b;
          pvVar4 = (v10 *)(settings.in_data.field_2._M_local_buf + 8);
          sfc::Palette::description_abi_cxx11_((string *)&__range2,(Palette *)local_1858);
          local_7d8 = local_18e0;
          pbStack_7d0 = local_18d8;
          vargs_8 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&__range2;
          local_7e0 = pvVar4;
          ::fmt::v10::
          make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,std::__cxx11::string_const>
                    (&local_818,pvVar4,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vargs_8,
                     local_18d8);
          local_7f0 = &local_818;
          local_220 = &local_7d8;
          local_828 = local_7d8;
          local_820 = pbStack_7d0;
          local_1c8 = &local_838;
          local_1b8 = 0xdd;
          local_838.desc_ = 0xdd;
          local_838.field_1.values_ =
               (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_7f0;
          fmt_03.size_ = (size_t)pbStack_7d0;
          fmt_03.data_ = local_7d8;
          local_218 = local_828;
          pbStack_210 = local_820;
          local_1d0 = local_7f0;
          local_1c0 = local_7f0;
          local_1b0 = local_1c8;
          local_1a8 = local_7f0;
          ::fmt::v10::vprint(fmt_03,local_838);
          std::__cxx11::string::~string((string *)&__range2);
        }
      }
      else {
        uVar2 = sfc::Image::palette_size
                          ((Image *)&crops.
                                     super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (uVar2 == 0) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar3,"\"--no-remap\" requires indexed color image");
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if ((mode_str.field_2._M_local_buf[0xf] & 1U) != 0) {
          local_18a0 = "Creating tile data straight from color indices\n";
          local_1898 = 0x2f;
          vargs_7 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
                    anon_var_dwarf_8a14a;
          sStack_690 = 0x2f;
          local_6b8[0] = ::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>()
          ;
          local_6a0 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_6b8;
          local_150 = &vargs_7;
          local_6c8 = vargs_7;
          local_6c0 = sStack_690;
          local_128 = &local_6d8;
          local_118 = 0;
          local_6d8.desc_ = 0;
          local_6d8.field_1.values_ = local_6a0;
          fmt_06.size_ = sStack_690;
          fmt_06.data_ = (char *)vargs_7;
          local_148 = local_6c8;
          sStack_140 = local_6c0;
          local_130 = local_6a0;
          local_120 = local_6a0;
          local_110 = local_128;
          local_108 = local_6a0;
          ::fmt::v10::vprint(fmt_06,local_6d8);
        }
      }
      __end2 = std::vector<sfc::Image,_std::allocator<sfc::Image>_>::begin
                         ((vector<sfc::Image,_std::allocator<sfc::Image>_> *)local_17e0);
      img = (Image *)std::vector<sfc::Image,_std::allocator<sfc::Image>_>::end
                               ((vector<sfc::Image,_std::allocator<sfc::Image>_> *)local_17e0);
      while( true ) {
        pvVar4 = (v10 *)&img;
        bVar1 = __gnu_cxx::
                operator==<sfc::Image_*,_std::vector<sfc::Image,_std::allocator<sfc::Image>_>_>
                          (&__end2,(__normal_iterator<sfc::Image_*,_std::vector<sfc::Image,_std::allocator<sfc::Image>_>_>
                                    *)pvVar4);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        local_1920 = __gnu_cxx::
                     __normal_iterator<sfc::Image_*,_std::vector<sfc::Image,_std::allocator<sfc::Image>_>_>
                     ::operator*(&__end2);
        sfc::Tileset::add((Tileset *)local_16d8,local_1920,(Palette *)local_1858);
        __gnu_cxx::
        __normal_iterator<sfc::Image_*,_std::vector<sfc::Image,_std::allocator<sfc::Image>_>_>::
        operator++(&__end2);
      }
      bVar1 = sfc::Tileset::is_full((Tileset *)local_16d8);
      if (bVar1) {
        local_1959 = 1;
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_1950 = (v10 *)0x1ce95f;
        local_1948 = (char *)0x3f;
        local_1954 = sfc::Tileset::size((Tileset *)local_16d8);
        local_1958 = sfc::Tileset::max((Tileset *)local_16d8);
        local_620 = &local_1940;
        local_630 = local_1950;
        pcStack_628 = local_1948;
        local_638 = (v10 *)&local_1954;
        local_640 = &local_1958;
        local_100 = &local_630;
        local_650 = local_1950;
        local_648 = local_1948;
        local_f8 = local_650;
        pcStack_f0 = local_648;
        ::fmt::v10::
        make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int,unsigned_int>
                  (&local_688,local_638,local_640,(uint *)local_1950);
        local_a8 = local_660;
        local_b0 = &local_688;
        local_98 = 0x22;
        fmt_11.size_ = 0x22;
        fmt_11.data_ = local_648;
        args_01.field_1.values_ = aVar6.values_;
        args_01.desc_ = (unsigned_long_long)local_b0;
        local_a0 = local_b0;
        local_90 = local_a8;
        local_88 = local_b0;
        ::fmt::v10::vformat_abi_cxx11_(&local_1940,local_650,fmt_11,args_01);
        std::runtime_error::runtime_error(prVar3,(string *)&local_1940);
        local_1959 = 0;
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((mode_str.field_2._M_local_buf[0xf] & 1U) != 0) {
        if (((undefined1)settings.mode & snes) == none) {
          local_1988 = (uint *)0x1ce9c0;
          local_1980 = 0x49;
          local_198c = sfc::Tileset::size((Tileset *)local_16d8);
          local_568 = local_1988;
          sStack_560 = local_1980;
          local_570 = (v10 *)&local_198c;
          vargs_10 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
                      *)local_16d8;
          ::fmt::v10::
          make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int,unsigned_int>
                    (&local_5a8,local_570,(uint *)vargs_10,local_1988);
          local_580 = &local_5a8;
          local_60 = &local_568;
          local_5b8 = local_568;
          local_5b0 = sStack_560;
          local_d8 = &local_5c8;
          local_c8 = 0x22;
          local_5c8.desc_ = 0x22;
          local_5c8.field_1.values_ =
               (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_580;
          fmt_08.size_ = sStack_560;
          fmt_08.data_ = (char *)local_568;
          local_e0 = local_580;
          local_d0 = local_580;
          local_c0 = local_d8;
          local_b8 = local_580;
          local_58 = local_5b8;
          sStack_50 = local_5b0;
          ::fmt::v10::vprint(fmt_08,local_5c8);
        }
        else {
          local_1974._4_8_ = "Created tileset with {} entries\n";
          local_1968 = 0x20;
          local_1974._0_4_ = sfc::Tileset::size((Tileset *)local_16d8);
          local_5d8 = (char *)local_1974._4_8_;
          sStack_5d0 = local_1968;
          vargs_9 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
                     *)local_1974;
          local_5f8[0] = ::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int>
                                   (vargs_9,pvVar4,args_00);
          local_5e8 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_5f8;
          local_80 = &local_5d8;
          local_608 = local_5d8;
          local_600 = sStack_5d0;
          local_3d8 = &local_618;
          local_3c0 = 2;
          local_618.desc_ = 2;
          local_618.field_1.values_ = local_5e8;
          fmt_07.size_ = sStack_5d0;
          fmt_07.data_ = local_5d8;
          local_3e0 = local_5e8;
          local_3d0 = local_5e8;
          local_3c8 = local_5e8;
          local_3b8 = local_3d8;
          local_78 = local_608;
          sStack_70 = local_600;
          ::fmt::v10::vprint(fmt_07,local_618);
        }
      }
      sfc::Palette::~Palette((Palette *)local_1858);
      std::vector<sfc::Image,_std::allocator<sfc::Image>_>::~vector
                ((vector<sfc::Image,_std::allocator<sfc::Image>_> *)local_17e0);
      sfc::Image::~Image((Image *)&crops.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      sfc::read_binary(&local_1728,(string *)((long)&settings.in_image.field_2 + 8));
      sfc::Tileset::Tileset
                (&local_1710,&local_1728,settings.out_image.field_2._8_4_,
                 settings.out_image.field_2._12_4_,settings.bpp,settings._168_4_,
                 (bool)(settings.mode._1_1_ & 1));
      sfc::Tileset::operator=((Tileset *)local_16d8,&local_1710);
      sfc::Tileset::~Tileset(&local_1710);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_1728);
      if ((mode_str.field_2._M_local_buf[0xf] & 1U) != 0) {
        pvVar4 = (v10 *)(settings.in_image.field_2._M_local_buf + 8);
        image._colors._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
             sfc::Tileset::size((Tileset *)local_16d8);
        local_848 = "Loaded tiles from \"{}\" ({} tiles)\n";
        sStack_840 = 0x22;
        vargs_4 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                   *)((long)&image._colors._M_t._M_impl.super__Rb_tree_header._M_node_count + 4);
        local_850 = pvVar4;
        ::fmt::v10::
        make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,unsigned_int>
                  (&local_888,pvVar4,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vargs_4,
                   (uint *)0x22);
        local_860 = &local_888;
        local_290 = &local_848;
        local_898 = local_848;
        local_890 = sStack_840;
        local_268 = &local_8a8;
        local_258 = 0x2d;
        local_8a8.desc_ = 0x2d;
        local_8a8.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_860;
        fmt_02.size_ = sStack_840;
        fmt_02.data_ = local_848;
        local_288 = local_898;
        sStack_280 = local_890;
        local_270 = local_860;
        local_260 = local_860;
        local_250 = local_268;
        local_248 = local_860;
        ::fmt::v10::vprint(fmt_02,local_8a8);
      }
    }
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&settings.in_palette.field_2 + 8));
    if (!bVar1) {
      psVar5 = (string *)(settings.in_palette.field_2._M_local_buf + 8);
      sfc::Tileset::save((Tileset *)local_16d8,psVar5);
      if ((mode_str.field_2._M_local_buf[0xf] & 1U) != 0) {
        tileset_image._colors._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)anon_var_dwarf_42342;
        vargs_11 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)((long)&settings.in_palette.field_2 + 8);
        local_4c0 = "Saved native tile data to \"{}\"\n";
        sStack_4b8 = 0x1f;
        local_4e8[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                                 (vargs_11,(v10 *)psVar5,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)"Saved native tile data to \"{}\"\n");
        local_4d0 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_4e8;
        local_40 = &local_4c0;
        local_4f8 = local_4c0;
        local_4f0 = sStack_4b8;
        local_4a8 = &local_508;
        local_430 = 0xd;
        local_508.desc_ = 0xd;
        local_508.field_1.values_ = local_4d0;
        fmt_10.size_ = sStack_4b8;
        fmt_10.data_ = local_4c0;
        local_4b0 = local_4d0;
        local_470 = local_4d0;
        local_438 = local_4d0;
        local_428 = local_4a8;
        local_38 = local_4f8;
        sStack_30 = local_4f0;
        ::fmt::v10::vprint(fmt_10,local_508);
      }
    }
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&settings.out_data.field_2 + 8));
    if (!bVar1) {
      sfc::Image::Image((Image *)local_1a28,(Tileset *)local_16d8,settings._180_4_);
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&settings.in_image.field_2 + 8));
      if (bVar1) {
        psVar5 = (string *)(settings.out_data.field_2._M_local_buf + 8);
        sfc::Image::save((Image *)local_1a28,psVar5);
      }
      else {
        psVar5 = (string *)(settings.out_data.field_2._M_local_buf + 8);
        sfc::Image::save_indexed((Image *)local_1a28,psVar5);
      }
      if ((mode_str.field_2._M_local_buf[0xf] & 1U) != 0) {
        vargs_12 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)((long)&settings.out_data.field_2 + 8);
        local_518 = "Saved tileset image to \"{}\"\n";
        sStack_510 = 0x1c;
        local_538[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                                 (vargs_12,(v10 *)psVar5,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)"Saved tileset image to \"{}\"\n");
        local_528 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_538;
        local_20 = &local_518;
        local_548 = local_518;
        local_540 = sStack_510;
        local_498 = &local_558;
        local_448 = 0xd;
        local_558.desc_ = 0xd;
        local_558.field_1.values_ = local_528;
        fmt_09.size_ = sStack_510;
        fmt_09.data_ = local_518;
        local_4a0 = local_528;
        local_478 = local_528;
        local_450 = local_528;
        local_440 = local_498;
        local_18 = local_548;
        sStack_10 = local_540;
        ::fmt::v10::vprint(fmt_09,local_558);
      }
      sfc::Image::~Image((Image *)local_1a28);
    }
    sfc::Tileset::~Tileset((Tileset *)local_16d8);
    argv_local._4_4_ = 0;
    local_1548 = 1;
  }
  SfcTiles::Settings::~Settings((Settings *)local_b28);
  return argv_local._4_4_;
}

Assistant:

int sfc_tiles(int argc, char* argv[]) {
  SfcTiles::Settings settings = {};
  bool verbose = false;

  try {
    bool help = false;
    std::string mode_str;

    Options options;
    options.IndentDescription = sfc::Constants::options_indent;
    options.Header = "Usage: superfamiconv tiles [<options>]\n";

    // clang-format off
    options.Add(settings.in_image,           'i', "in-image",       "Input: image");
    options.Add(settings.in_data,            'n', "in-data",        "Input: native data");
    options.Add(settings.in_palette,         'p', "in-palette",     "Input: palette (native/json)");
    options.Add(settings.out_data,           'd', "out-data",       "Output: native data");
    options.Add(settings.out_image,          'o', "out-image",      "Output: image");

    options.Add(mode_str,                    'M', "mode",           "Mode <default: snes>",              std::string("snes"), "Settings");
    options.Add(settings.bpp,                'B', "bpp",            "Bits per pixel",                    unsigned(4),         "Settings");
    options.Add(settings.tile_w,             'W', "tile-width",     "Tile width",                        unsigned(8),         "Settings");
    options.Add(settings.tile_h,             'H', "tile-height",    "Tile height",                       unsigned(8),         "Settings");
    options.AddSwitch(settings.no_remap,     'R', "no-remap",       "Don't remap colors",                false,               "Settings");
    options.AddSwitch(settings.no_discard,   'D', "no-discard",     "Don't discard redundant tiles",     false,               "Settings");
    options.AddSwitch(settings.no_flip,      'F', "no-flip",        "Don't discard using tile flipping", false,               "Settings");
    options.AddSwitch(settings.sprite_mode,  'S', "sprite-mode",    "Apply sprite output settings",      false,               "Settings");
    options.Add(settings.max_tiles,          'T', "max-tiles",      "Maximum number of tiles",           unsigned(),          "Settings");
    options.Add(settings.out_image_width,   '\0', "out-image-width","Width of out-image",                unsigned(),          "Settings");

    options.AddSwitch(verbose,               'v', "verbose",        "Verbose logging", false, "_");
    options.AddSwitch(help,                  'h', "help",           "Show this help",  false, "_");
    // clang-format on

    if (!options.Parse(argc, argv))
      return 1;

    if (argc <= 2 || help) {
      std::cout << options.Usage();
      return 0;
    }

    settings.mode = sfc::mode(mode_str);

    // Set pce_sprite mode and sprite_mode interchangeably
    if (settings.sprite_mode && settings.mode == sfc::Mode::pce)
      settings.mode = sfc::Mode::pce_sprite;
    if (settings.mode == sfc::Mode::pce_sprite)
      settings.sprite_mode = true;

    // Mode-specific defaults
    if (!options.WasSet("bpp"))
      settings.bpp = sfc::default_bpp_for_mode(settings.mode);
    if (!options.WasSet("tile-width"))
      settings.tile_w = sfc::default_tile_size_for_mode(settings.mode);
    if (!options.WasSet("tile-height"))
      settings.tile_h = sfc::default_tile_size_for_mode(settings.mode);
    if (!options.WasSet("no-flip"))
      settings.no_flip = !sfc::tile_flipping_allowed_for_mode(settings.mode);
    if (!options.WasSet("max-tiles"))
      settings.max_tiles = sfc::max_tile_count_for_mode(settings.mode);

    if (!sfc::tile_width_allowed_for_mode(settings.tile_w, settings.mode)) {
      settings.tile_w = sfc::default_tile_size_for_mode(settings.mode);
      if (verbose)
        fmt::print("Tile width not allowed for specified mode, using default ({})\n", settings.tile_w);
    }

    if (!sfc::tile_height_allowed_for_mode(settings.tile_h, settings.mode)) {
      settings.tile_h = sfc::default_tile_size_for_mode(settings.mode);
      if (verbose)
        fmt::print("Tile height not allowed for specified mode, using default ({})\n", settings.tile_h);
    }

    // Sprite mode defaults
    if (settings.sprite_mode) {
      settings.no_discard = settings.no_flip = true;
    }

    if (!sfc::bpp_allowed_for_mode(settings.bpp, settings.mode))
      throw std::runtime_error("bpp setting not allowed for specified mode");

  } catch (const std::exception& e) {
    fmt::print(stderr, "Error: {}\n", e.what());
    return 1;
  }

  try {
    if (settings.in_image.empty() && settings.in_data.empty())
      throw std::runtime_error("Input image or native data required");

    if (verbose)
      fmt::print("Performing tiles operation in \"{}\" mode\n", sfc::mode(settings.mode));

    sfc::Tileset tileset;

    if (!settings.in_data.empty()) {
      // Native data input
      tileset = sfc::Tileset(sfc::read_binary(settings.in_data), settings.mode, settings.bpp, settings.tile_w, settings.tile_h,
                             settings.no_flip);
      if (verbose)
        fmt::print("Loaded tiles from \"{}\" ({} tiles)\n", settings.in_data, tileset.size());

    } else {
      // Image input
      sfc::Image image(settings.in_image);
      std::vector<sfc::Image> crops = image.crops(settings.tile_w, settings.tile_h, settings.mode);
      if (verbose)
        fmt::print("Loaded image from \"{}\" ({})\n", settings.in_image, image.description());

      if (settings.mode == sfc::Mode::pce && settings.sprite_mode) {
        if (image.width() % 16 || image.height() % 16)
          throw std::runtime_error("pce/sprite-mode requires image dimensions to be a multiple of 16");
      }

      if (verbose)
        fmt::print("Image sliced into {} {}x{}px tiles\n", crops.size(), settings.tile_w, settings.tile_h);

      sfc::Palette palette;
      tileset = sfc::Tileset(settings.mode, settings.bpp, settings.tile_w, settings.tile_h, settings.no_discard, settings.no_flip,
                             settings.no_remap, settings.max_tiles);

      if (settings.no_remap) {
        if (image.palette_size() == 0)
          throw std::runtime_error("\"--no-remap\" requires indexed color image");
        if (verbose)
          fmt::print("Creating tile data straight from color indices\n");

      } else {
        if (settings.in_palette.empty())
          throw std::runtime_error("Input palette required (except in --no-remap mode)");
        palette = sfc::Palette(settings.in_palette, settings.mode, sfc::palette_size_at_bpp(settings.bpp));
        if (palette.size() < 1)
          throw std::runtime_error("Input palette size is zero");
        if (verbose)
          fmt::print("Remapping tile data from palette \"{}\" ({})\n", settings.in_palette, palette.description());
      }

      for (auto& img : crops)
        tileset.add(img, &palette);
      if (tileset.is_full()) {
        throw std::runtime_error(
          fmt::format("Tileset exceeds maximum size ({} entries generated, {} maximum)", tileset.size(), tileset.max()));
      }
      if (verbose) {
        if (settings.no_discard) {
          fmt::print("Created tileset with {} entries\n", tileset.size());
        } else {
          fmt::print("Created optimized tileset with {} entries (discarded {} redundant tiles)\n", tileset.size(),
                     tileset.discarded_tiles);
        }
      }
    }

    // Write data
    if (!settings.out_data.empty()) {
      tileset.save(settings.out_data);
      if (verbose)
        fmt::print("Saved native tile data to \"{}\"\n", settings.out_data);
    }

    if (!settings.out_image.empty()) {
      sfc::Image tileset_image(tileset, settings.out_image_width);
      if (!settings.in_data.empty()) {
        tileset_image.save_indexed(settings.out_image);
      } else {
        tileset_image.save(settings.out_image);
      }
      if (verbose)
        fmt::print("Saved tileset image to \"{}\"\n", settings.out_image);
    }

  } catch (const std::exception& e) {
    fmt::print(stderr, "Error: {}\n", e.what());
    return 1;
  }

  return 0;
}